

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O2

void qDrawWinPanel(QPainter *p,int x,int y,int w,int h,QPalette *pal,bool sunken,QBrush *fill)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QBrush *pQVar4;
  
  if (sunken) {
    pQVar4 = QPalette::dark(pal);
    lVar1 = *(long *)pQVar4;
    pQVar4 = QPalette::light(pal);
    lVar2 = *(long *)pQVar4;
    pQVar4 = QPalette::shadow(pal);
    lVar3 = *(long *)pQVar4;
    pQVar4 = QPalette::midlight(pal);
  }
  else {
    pQVar4 = QPalette::light(pal);
    lVar1 = *(long *)pQVar4;
    pQVar4 = QPalette::shadow(pal);
    lVar2 = *(long *)pQVar4;
    pQVar4 = QPalette::midlight(pal);
    lVar3 = *(long *)pQVar4;
    pQVar4 = QPalette::dark(pal);
  }
  qDrawWinShades(p,x,y,w,h,(QColor *)(lVar1 + 8),(QColor *)(lVar2 + 8),(QColor *)(lVar3 + 8),
                 (QColor *)(*(long *)pQVar4 + 8),fill);
  return;
}

Assistant:

void qDrawWinPanel(QPainter *p, int x, int y, int w, int h,
                    const QPalette &pal, bool        sunken,
                    const QBrush *fill)
{
    if (sunken)
        qDrawWinShades(p, x, y, w, h,
                        pal.dark().color(), pal.light().color(), pal.shadow().color(),
                       pal.midlight().color(), fill);
    else
        qDrawWinShades(p, x, y, w, h,
                       pal.light().color(), pal.shadow().color(), pal.midlight().color(),
                       pal.dark().color(), fill);
}